

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

Value * choc::value::createObject(Value *__return_storage_ptr__,string_view className)

{
  Allocator *in_R8;
  string_view className_00;
  Type local_40;
  Type *pTStack_20;
  string_view className_local;
  
  className_00._M_len = className._M_str;
  pTStack_20 = (Type *)className._M_len;
  className_00._M_str = (char *)0x0;
  className_local._M_len = (size_t)className_00._M_len;
  className_local._M_str = (char *)__return_storage_ptr__;
  Type::createObject(&local_40,pTStack_20,className_00,in_R8);
  Value::Value(__return_storage_ptr__,&local_40);
  Type::~Type(&local_40);
  return __return_storage_ptr__;
}

Assistant:

inline Value createObject (std::string_view className)
{
    return Value (Type::createObject (className));
}